

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOCBparser.c
# Opt level: O1

docbDocPtr docbParseFile(char *filename,char *encoding)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlDocPtr pxVar4;
  
  if (docbParseFile_deprecated == '\0') {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"docbParseFile() deprecated function reached\n");
    docbParseFile_deprecated = '\x01';
  }
  pxVar4 = xmlParseFile(filename);
  return pxVar4;
}

Assistant:

docbDocPtr
docbParseFile(const char *filename ATTRIBUTE_UNUSED,
              const char *encoding ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "docbParseFile() deprecated function reached\n");
        deprecated = 1;
    }

    return (xmlParseFile(filename));
}